

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Color * LoadImageColors(Image image)

{
  ushort uVar1;
  long in_stack_00000008;
  byte local_26;
  byte bStack_25;
  int iStack_20;
  unsigned_short pixel_2;
  unsigned_short pixel_1;
  unsigned_short pixel;
  int k;
  int i;
  Color *pixels;
  
  if (((int)image.data == 0) || (image.data._4_4_ == 0)) {
    pixels = (Color *)0x0;
  }
  else {
    pixels = (Color *)malloc((long)((int)image.data * image.data._4_4_) << 2);
    if (image.height < 0xb) {
      if (((image.height == 8) || (image.height == 9)) || (image.height == 10)) {
        TraceLog(4,"IMAGE: Pixel format converted from 32bit to 8bit per channel");
      }
      iStack_20 = 0;
      for (_pixel_1 = 0; _pixel_1 < (int)image.data * image.data._4_4_; _pixel_1 = _pixel_1 + 1) {
        switch(image.height) {
        case 1:
          pixels[_pixel_1].r = *(uchar *)(in_stack_00000008 + _pixel_1);
          pixels[_pixel_1].g = *(uchar *)(in_stack_00000008 + _pixel_1);
          pixels[_pixel_1].b = *(uchar *)(in_stack_00000008 + _pixel_1);
          pixels[_pixel_1].a = 0xff;
          break;
        case 2:
          pixels[_pixel_1].r = *(uchar *)(in_stack_00000008 + iStack_20);
          pixels[_pixel_1].g = *(uchar *)(in_stack_00000008 + iStack_20);
          pixels[_pixel_1].b = *(uchar *)(in_stack_00000008 + iStack_20);
          pixels[_pixel_1].a = *(uchar *)(in_stack_00000008 + (iStack_20 + 1));
          iStack_20 = iStack_20 + 2;
          break;
        case 3:
          uVar1 = *(ushort *)(in_stack_00000008 + (long)_pixel_1 * 2);
          pixels[_pixel_1].r = (uchar)(int)((float)(uVar1 >> 0xb) * 8.0);
          pixels[_pixel_1].g = (uchar)(int)((float)(uVar1 >> 5 & 0x3f) * 4.0);
          pixels[_pixel_1].b = (uchar)(int)((float)(uVar1 & 0x1f) * 8.0);
          pixels[_pixel_1].a = 0xff;
          break;
        case 4:
          pixels[_pixel_1].r = *(uchar *)(in_stack_00000008 + iStack_20);
          pixels[_pixel_1].g = *(uchar *)(in_stack_00000008 + (iStack_20 + 1));
          pixels[_pixel_1].b = *(uchar *)(in_stack_00000008 + (iStack_20 + 2));
          pixels[_pixel_1].a = 0xff;
          iStack_20 = iStack_20 + 3;
          break;
        case 5:
          uVar1 = *(ushort *)(in_stack_00000008 + (long)_pixel_1 * 2);
          pixels[_pixel_1].r = (uchar)(int)((float)(uVar1 >> 0xb) * 8.0);
          pixels[_pixel_1].g = (uchar)(int)((float)(uVar1 >> 6 & 0x1f) * 8.0);
          pixels[_pixel_1].b = (uchar)(int)((float)((uVar1 & 0x3e) >> 1) * 8.0);
          pixels[_pixel_1].a = -((byte)uVar1 & 1);
          break;
        case 6:
          uVar1 = *(ushort *)(in_stack_00000008 + (long)_pixel_1 * 2);
          pixels[_pixel_1].r = (uchar)(int)((float)(uVar1 >> 0xc) * 17.0);
          bStack_25 = (byte)(uVar1 >> 8);
          pixels[_pixel_1].g = (uchar)(int)((float)(bStack_25 & 0xf) * 17.0);
          local_26 = (byte)uVar1;
          pixels[_pixel_1].b = (uchar)(int)((float)(local_26 >> 4) * 17.0);
          pixels[_pixel_1].a = (uchar)(int)((float)(uVar1 & 0xf) * 17.0);
          break;
        case 7:
          pixels[_pixel_1].r = *(uchar *)(in_stack_00000008 + iStack_20);
          pixels[_pixel_1].g = *(uchar *)(in_stack_00000008 + (iStack_20 + 1));
          pixels[_pixel_1].b = *(uchar *)(in_stack_00000008 + (iStack_20 + 2));
          pixels[_pixel_1].a = *(uchar *)(in_stack_00000008 + (iStack_20 + 3));
          iStack_20 = iStack_20 + 4;
          break;
        case 8:
          pixels[_pixel_1].r =
               (uchar)(int)(*(float *)(in_stack_00000008 + (long)iStack_20 * 4) * 255.0);
          pixels[_pixel_1].g = '\0';
          pixels[_pixel_1].b = '\0';
          pixels[_pixel_1].a = 0xff;
          break;
        case 9:
          pixels[_pixel_1].r =
               (uchar)(int)(*(float *)(in_stack_00000008 + (long)iStack_20 * 4) * 255.0);
          pixels[_pixel_1].g =
               (uchar)(int)(*(float *)(in_stack_00000008 + 4 + (long)iStack_20 * 4) * 255.0);
          pixels[_pixel_1].b =
               (uchar)(int)(*(float *)(in_stack_00000008 + 8 + (long)iStack_20 * 4) * 255.0);
          pixels[_pixel_1].a = 0xff;
          iStack_20 = iStack_20 + 3;
          break;
        case 10:
          pixels[_pixel_1].r =
               (uchar)(int)(*(float *)(in_stack_00000008 + (long)iStack_20 * 4) * 255.0);
          pixels[_pixel_1].g =
               (uchar)(int)(*(float *)(in_stack_00000008 + (long)iStack_20 * 4) * 255.0);
          pixels[_pixel_1].b =
               (uchar)(int)(*(float *)(in_stack_00000008 + (long)iStack_20 * 4) * 255.0);
          pixels[_pixel_1].a =
               (uchar)(int)(*(float *)(in_stack_00000008 + (long)iStack_20 * 4) * 255.0);
          iStack_20 = iStack_20 + 4;
        }
      }
    }
    else {
      TraceLog(4,"IMAGE: Pixel data retrieval not supported for compressed image formats");
    }
  }
  return pixels;
}

Assistant:

Color *LoadImageColors(Image image)
{
    if ((image.width == 0) || (image.height == 0)) return NULL;

    Color *pixels = (Color *)RL_MALLOC(image.width*image.height*sizeof(Color));

    if (image.format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "IMAGE: Pixel data retrieval not supported for compressed image formats");
    else
    {
        if ((image.format == PIXELFORMAT_UNCOMPRESSED_R32) ||
            (image.format == PIXELFORMAT_UNCOMPRESSED_R32G32B32) ||
            (image.format == PIXELFORMAT_UNCOMPRESSED_R32G32B32A32)) TRACELOG(LOG_WARNING, "IMAGE: Pixel format converted from 32bit to 8bit per channel");

        for (int i = 0, k = 0; i < image.width*image.height; i++)
        {
            switch (image.format)
            {
                case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
                {
                    pixels[i].r = ((unsigned char *)image.data)[i];
                    pixels[i].g = ((unsigned char *)image.data)[i];
                    pixels[i].b = ((unsigned char *)image.data)[i];
                    pixels[i].a = 255;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
                {
                    pixels[i].r = ((unsigned char *)image.data)[k];
                    pixels[i].g = ((unsigned char *)image.data)[k];
                    pixels[i].b = ((unsigned char *)image.data)[k];
                    pixels[i].a = ((unsigned char *)image.data)[k + 1];

                    k += 2;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    pixels[i].r = (unsigned char)((float)((pixel & 0b1111100000000000) >> 11)*(255/31));
                    pixels[i].g = (unsigned char)((float)((pixel & 0b0000011111000000) >> 6)*(255/31));
                    pixels[i].b = (unsigned char)((float)((pixel & 0b0000000000111110) >> 1)*(255/31));
                    pixels[i].a = (unsigned char)((pixel & 0b0000000000000001)*255);

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    pixels[i].r = (unsigned char)((float)((pixel & 0b1111100000000000) >> 11)*(255/31));
                    pixels[i].g = (unsigned char)((float)((pixel & 0b0000011111100000) >> 5)*(255/63));
                    pixels[i].b = (unsigned char)((float)(pixel & 0b0000000000011111)*(255/31));
                    pixels[i].a = 255;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    pixels[i].r = (unsigned char)((float)((pixel & 0b1111000000000000) >> 12)*(255/15));
                    pixels[i].g = (unsigned char)((float)((pixel & 0b0000111100000000) >> 8)*(255/15));
                    pixels[i].b = (unsigned char)((float)((pixel & 0b0000000011110000) >> 4)*(255/15));
                    pixels[i].a = (unsigned char)((float)(pixel & 0b0000000000001111)*(255/15));

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
                {
                    pixels[i].r = ((unsigned char *)image.data)[k];
                    pixels[i].g = ((unsigned char *)image.data)[k + 1];
                    pixels[i].b = ((unsigned char *)image.data)[k + 2];
                    pixels[i].a = ((unsigned char *)image.data)[k + 3];

                    k += 4;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
                {
                    pixels[i].r = (unsigned char)((unsigned char *)image.data)[k];
                    pixels[i].g = (unsigned char)((unsigned char *)image.data)[k + 1];
                    pixels[i].b = (unsigned char)((unsigned char *)image.data)[k + 2];
                    pixels[i].a = 255;

                    k += 3;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32:
                {
                    pixels[i].r = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].g = 0;
                    pixels[i].b = 0;
                    pixels[i].a = 255;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32:
                {
                    pixels[i].r = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].g = (unsigned char)(((float *)image.data)[k + 1]*255.0f);
                    pixels[i].b = (unsigned char)(((float *)image.data)[k + 2]*255.0f);
                    pixels[i].a = 255;

                    k += 3;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
                {
                    pixels[i].r = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].g = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].b = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].a = (unsigned char)(((float *)image.data)[k]*255.0f);

                    k += 4;
                } break;
                default: break;
            }
        }
    }

    return pixels;
}